

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O3

LOs __thiscall Omega_h::Dist::items2dest_idxs(Dist *this)

{
  int *piVar1;
  LO size_in;
  void *extraout_RDX;
  Dist *in_RSI;
  LOs LVar2;
  Dist inverse;
  Read<int> local_e0;
  string local_d0;
  Dist local_b0;
  
  invert(&local_b0,in_RSI);
  size_in = ndests(in_RSI);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  Read<int>::Read(&local_e0,size_in,0,1,&local_d0);
  exch<int>(this,(Read<int> *)&local_b0,(Int)&local_e0);
  if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
      operator_delete(local_e0.write_.shared_alloc_.alloc,0x48);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  ~Dist(&local_b0);
  LVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar2.write_.shared_alloc_;
}

Assistant:

LOs Dist::items2dest_idxs() const {
  auto inverse = invert();
  return inverse.exch(LOs(ndests(), 0, 1), 1);
}